

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndModule(BinaryReaderObjdump *this)

{
  ObjdumpOptions *pOVar1;
  ObjdumpState *pOVar2;
  pointer pRVar3;
  long lVar4;
  Enum EVar5;
  ulong uVar6;
  
  pOVar1 = (this->super_BinaryReaderObjdumpBase).options_;
  if ((pOVar1->section_name == (char *)0x0) ||
     ((this->super_BinaryReaderObjdumpBase).section_found_ != false)) {
    EVar5 = Ok;
    if (((pOVar1->relocs == true) && (pOVar1->mode == Details)) &&
       (EVar5 = Ok, ((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
      pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      lVar4 = (long)(pOVar2->data_relocations).
                    super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pOVar2->data_relocations).
                    super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (lVar4 / 0x18 != (ulong)this->next_data_reloc_) {
        Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                         .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->
                        super_Stream,"Data reloctions outside of segments!:\n",lVar4 % 0x18);
        uVar6 = (ulong)this->next_data_reloc_;
        lVar4 = uVar6 * 0x18;
        EVar5 = Error;
        for (; pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_,
            pRVar3 = (pOVar2->data_relocations).
                     super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar6 < (ulong)(((long)(pOVar2->data_relocations).
                                   super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x18)
            ; uVar6 = uVar6 + 1) {
          BinaryReaderObjdumpBase::PrintRelocation
                    (&this->super_BinaryReaderObjdumpBase,(Reloc *)((long)&pRVar3->type + lVar4),
                     *(Offset *)((long)&pRVar3->offset + lVar4));
          lVar4 = lVar4 + 0x18;
        }
      }
    }
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Section not found: %s\n");
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderObjdump::EndModule() {
  if (options_->section_name && !section_found_) {
    err_stream_->Writef("Section not found: %s\n", options_->section_name);
    return Result::Error;
  }

  if (options_->relocs && ShouldPrintDetails()) {
    if (next_data_reloc_ != objdump_state_->data_relocations.size()) {
      err_stream_->Writef("Data reloctions outside of segments!:\n");
      for (size_t i = next_data_reloc_;
           i < objdump_state_->data_relocations.size(); i++) {
        const Reloc& reloc = objdump_state_->data_relocations[i];
        PrintRelocation(reloc, reloc.offset);
      }

      return Result::Error;
    }
  }

  return Result::Ok;
}